

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  MCInst *in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint pred;
  uint Rd;
  DecodeStatus S;
  uint uVar7;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar7 = 0;
  uVar4 = fieldFromInstruction_4(in_ESI,0,0xc);
  uVar7 = uVar4 | uVar7;
  uVar4 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar7 = uVar4 << 0xc | uVar7;
  uVar5 = MCInst_getOpcode(in_RDI);
  if (uVar5 == 0xdc) {
    DVar6 = DecodeGPRnopcRegisterClass
                      (in_RDX,(uint)((ulong)in_RCX >> 0x20),CONCAT44(local_4,uVar2),
                       (void *)CONCAT44(uVar3,uVar7));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar6 = DecodeGPRnopcRegisterClass
                    (in_RDX,(uint)((ulong)in_RCX >> 0x20),CONCAT44(local_4,uVar2),
                     (void *)CONCAT44(uVar3,uVar7));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
  if (_Var1) {
    MCOperand_CreateImm0(in_RDI,(ulong)uVar7);
    DVar6 = DecodePredicateOperand(in_RCX,local_4,CONCAT44(uVar3,uVar7),(void *)0x298247);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 12) << 0);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);

	if (MCInst_getOpcode(Inst) == ARM_MOVTi16)
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}